

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O2

bool __thiscall OpenMD::Sphere::isInterior(Sphere *this,Vector3d *pos)

{
  double dVar1;
  Vector3d r;
  Vector<double,_3U> VStack_48;
  Vector<double,_3U> local_30;
  
  operator-(&VStack_48,&pos->super_Vector<double,_3U>,&(this->origin_).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&local_30,&VStack_48);
  dVar1 = Vector<double,_3U>::length(&local_30);
  return dVar1 < this->radius_;
}

Assistant:

bool Sphere::isInterior(Vector3d pos) {
    Vector3d r = pos - origin_;

    bool result;
    if (r.length() < radius_)
      result = true;
    else
      result = false;

    return result;
  }